

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<const_Catch::IConfig> * __thiscall
Catch::Ptr<const_Catch::IConfig>::operator=
          (Ptr<const_Catch::IConfig> *this,Ptr<const_Catch::IConfig> *other)

{
  IConfig *pIVar1;
  IConfig *pIVar2;
  
  pIVar1 = other->m_p;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  pIVar2 = this->m_p;
  this->m_p = pIVar1;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return this;
}

Assistant:

Ptr& operator = (Ptr const& other) {
			Ptr temp(other);
			swap(temp);
			return *this;
		}